

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O1

bool __thiscall Sock::WaitMany(Sock *this,milliseconds timeout,EventsPerSock *events_per_sock)

{
  byte *pbVar1;
  ushort uVar2;
  _Hash_node_base *p_Var3;
  int iVar4;
  pointer ppVar5;
  _Hash_node_base *p_Var6;
  EventsPerSock *__range1;
  long in_FS_OFFSET;
  vector<pollfd,_std::allocator<pollfd>_> pfds;
  vector<pollfd,_std::allocator<pollfd>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pollfd *)0x0;
  local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pollfd *)0x0;
  for (p_Var6 = (events_per_sock->_M_h)._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
      p_Var6 = p_Var6->_M_nxt) {
    if (local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<pollfd,_std::allocator<pollfd>_>::_M_realloc_insert<>
                (&local_48,
                 (iterator)
                 local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    else {
      (local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
      _M_finish)->fd = 0;
      (local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
      _M_finish)->events = 0;
      (local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
      _M_finish)->revents = 0;
      local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
    _M_finish[-1].fd = *(int *)&p_Var6[1]._M_nxt[1]._M_nxt;
    p_Var3 = p_Var6[3]._M_nxt;
    if (((ulong)p_Var3 & 1) != 0) {
      *(byte *)&local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].events =
           (byte)local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].events | 1;
    }
    if (((ulong)p_Var3 & 2) != 0) {
      *(byte *)&local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].events =
           (byte)local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].events | 4;
    }
  }
  iVar4 = poll((pollfd *)
               local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,(int)timeout.__r);
  if (iVar4 != -1) {
    if ((long)local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != (events_per_sock->_M_h)._M_element_count) {
      __assert_fail("pfds.size() == events_per_sock.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/sock.cpp"
                    ,0xb3,
                    "virtual bool Sock::WaitMany(std::chrono::milliseconds, EventsPerSock &) const")
      ;
    }
    ppVar5 = local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (p_Var6 = (events_per_sock->_M_h)._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
        p_Var6 = p_Var6->_M_nxt) {
      if (*(int *)&p_Var6[1]._M_nxt[1]._M_nxt != ((pollfd *)ppVar5)->fd) {
        __assert_fail("sock->m_socket == static_cast<SOCKET>(pfds[i].fd)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/sock.cpp"
                      ,0xb6,
                      "virtual bool Sock::WaitMany(std::chrono::milliseconds, EventsPerSock &) const"
                     );
      }
      *(undefined1 *)((long)&p_Var6[3]._M_nxt + 1) = 0;
      uVar2 = ((pollfd *)ppVar5)->revents;
      *(byte *)((long)&p_Var6[3]._M_nxt + 1) = (byte)uVar2 & 1;
      if ((uVar2 & 4) != 0) {
        pbVar1 = (byte *)((long)&p_Var6[3]._M_nxt + 1);
        *pbVar1 = *pbVar1 | 2;
      }
      if ((uVar2 & 0x18) != 0) {
        pbVar1 = (byte *)((long)&p_Var6[3]._M_nxt + 1);
        *pbVar1 = *pbVar1 | 4;
      }
      ppVar5 = (pointer)((pollfd *)ppVar5 + 1);
    }
  }
  if (local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar4 != -1;
  }
  __stack_chk_fail();
}

Assistant:

bool Sock::WaitMany(std::chrono::milliseconds timeout, EventsPerSock& events_per_sock) const
{
#ifdef USE_POLL
    std::vector<pollfd> pfds;
    for (const auto& [sock, events] : events_per_sock) {
        pfds.emplace_back();
        auto& pfd = pfds.back();
        pfd.fd = sock->m_socket;
        if (events.requested & RECV) {
            pfd.events |= POLLIN;
        }
        if (events.requested & SEND) {
            pfd.events |= POLLOUT;
        }
    }

    if (poll(pfds.data(), pfds.size(), count_milliseconds(timeout)) == SOCKET_ERROR) {
        return false;
    }

    assert(pfds.size() == events_per_sock.size());
    size_t i{0};
    for (auto& [sock, events] : events_per_sock) {
        assert(sock->m_socket == static_cast<SOCKET>(pfds[i].fd));
        events.occurred = 0;
        if (pfds[i].revents & POLLIN) {
            events.occurred |= RECV;
        }
        if (pfds[i].revents & POLLOUT) {
            events.occurred |= SEND;
        }
        if (pfds[i].revents & (POLLERR | POLLHUP)) {
            events.occurred |= ERR;
        }
        ++i;
    }

    return true;
#else
    fd_set recv;
    fd_set send;
    fd_set err;
    FD_ZERO(&recv);
    FD_ZERO(&send);
    FD_ZERO(&err);
    SOCKET socket_max{0};

    for (const auto& [sock, events] : events_per_sock) {
        if (!sock->IsSelectable()) {
            return false;
        }
        const auto& s = sock->m_socket;
        if (events.requested & RECV) {
            FD_SET(s, &recv);
        }
        if (events.requested & SEND) {
            FD_SET(s, &send);
        }
        FD_SET(s, &err);
        socket_max = std::max(socket_max, s);
    }

    timeval tv = MillisToTimeval(timeout);

    if (select(socket_max + 1, &recv, &send, &err, &tv) == SOCKET_ERROR) {
        return false;
    }

    for (auto& [sock, events] : events_per_sock) {
        const auto& s = sock->m_socket;
        events.occurred = 0;
        if (FD_ISSET(s, &recv)) {
            events.occurred |= RECV;
        }
        if (FD_ISSET(s, &send)) {
            events.occurred |= SEND;
        }
        if (FD_ISSET(s, &err)) {
            events.occurred |= ERR;
        }
    }

    return true;
#endif /* USE_POLL */
}